

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall
MipsParser::parseVfpuRegister(MipsParser *this,Parser *parser,MipsRegisterValue *reg,int size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  int iVar5;
  Token *this_00;
  Identifier *pIVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  this_00 = Parser::peekToken(parser,0);
  if (this_00->type != Identifier) {
    return false;
  }
  pIVar6 = Token::identifierValue(this_00);
  if ((pIVar6->_name)._M_string_length != 4) {
    return false;
  }
  pIVar6 = Token::identifierValue(this_00);
  pcVar4 = (pIVar6->_name)._M_dataplus._M_p;
  bVar1 = pcVar4[1];
  if (9 < (byte)(bVar1 - 0x30)) {
    return false;
  }
  bVar2 = pcVar4[2];
  if (9 < (byte)(bVar2 - 0x30)) {
    return false;
  }
  bVar3 = pcVar4[3];
  if (9 < (byte)(bVar3 - 0x30)) {
    return false;
  }
  iVar5 = tolower((int)*pcVar4);
  if (3 < (uint)size) {
    return false;
  }
  uVar7 = bVar3 - 0x30;
  if (3 < uVar7) {
    return false;
  }
  uVar9 = bVar2 - 0x30;
  if (3 < uVar9) {
    return false;
  }
  uVar11 = bVar1 - 0x30;
  if (7 < uVar11) {
    return false;
  }
  reg->num = 0;
  uVar10 = 0;
  uVar8 = uVar7;
  if (iVar5 == 99) {
LAB_001595da:
    reg->type = VfpuVector;
    if (size != 3) {
      if (size == 2) {
        if ((uVar8 & 2) != 0) {
          return false;
        }
        uVar7 = uVar8 * 2;
        goto LAB_0015961c;
      }
      if (size != 1) {
        return false;
      }
    }
    uVar7 = uVar8;
    if ((uVar8 & 1) == 0) goto LAB_0015961c;
  }
  else {
    if (iVar5 == 0x65) {
      reg->num = 0x20;
      uVar10 = 0x20;
    }
    else if (iVar5 != 0x6d) {
      if (iVar5 == 0x73) {
        reg->type = VfpuVector;
        uVar10 = 0;
        if (size != 0) {
          return false;
        }
        goto LAB_0015961c;
      }
      if (iVar5 != 0x72) {
        return false;
      }
      reg->num = 0x20;
      uVar10 = 0x20;
      uVar8 = uVar9;
      uVar9 = uVar7;
      goto LAB_001595da;
    }
    reg->type = VfpuMatrix;
    if (size != 3) {
      if (size == 2) {
        if (1 < uVar7) {
          return false;
        }
        uVar7 = uVar7 * 2;
        goto LAB_0015961c;
      }
      if (size != 1) {
        return false;
      }
    }
    if ((bVar3 & 1) == 0) {
LAB_0015961c:
      reg->num = uVar7 << 5 | uVar11 * 4 | uVar10 | uVar9;
      std::__cxx11::string::_M_assign((string *)&reg->name);
      Parser::eatToken(parser);
      return true;
    }
  }
  return false;
}

Assistant:

bool MipsParser::parseVfpuRegister(Parser& parser, MipsRegisterValue& reg, int size)
{
	const Token& token = parser.peekToken();
	if (token.type != TokenType::Identifier || token.identifierValue().size() != 4)
		return false;

	const Identifier &identifier = token.identifierValue();

	int mtx,col,row;
	if (!decodeDigit(identifier.string()[1],mtx)) return false;
	if (!decodeDigit(identifier.string()[2],col)) return false;
	if (!decodeDigit(identifier.string()[3],row)) return false;
	int mode = tolower(identifier.string()[0]);

	if (size < 0 || size > 3)
		return false;

	if (row > 3 || col > 3 || mtx > 7)
		return false;

	reg.num = 0;
	switch (mode)
	{
	case 'r':					// transposed vector
		reg.num |= (1 << 5);
		std::swap(col,row);
		[[fallthrough]];
	case 'c':					// vector	
		reg.type = MipsRegisterType::VfpuVector;

		switch (size)
		{
		case 1:	// pair
		case 3: // quad
			if (row & 1)
				return false;
			break;
		case 2:	// triple
			if (row & 2)
				return false;
			row <<= 1;
			break;
		default:
			return false;
		}
		break;
	case 's':					// single
		reg.type = MipsRegisterType::VfpuVector;

		if (size != 0)
			return false;
		break;
	case 'e':					// transposed matrix
		reg.num |= (1 << 5);
		[[fallthrough]];
	case 'm':					// matrix
		reg.type = MipsRegisterType::VfpuMatrix;

		// check size
		switch (size)
		{
		case 1:	// 2x2
		case 3:	// 4x4
			if (row & 1)
				return false;
			break;
		case 2:	// 3x3
			if (row & ~1)
				return false;
			row <<= 1;
			break;
		default:
			return false;
		}
		break;
	default:
		return false;
	}

	reg.num |= mtx << 2;
	reg.num |= col;
	reg.num |= row << 5;

	reg.name = identifier;
	parser.eatToken();
	return true;
}